

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O3

cmValue __thiscall cmStateDirectory::GetProperty(cmStateDirectory *this,string *prop,bool chain)

{
  cmStateSnapshot *this_00;
  size_t __n;
  char *pcVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  PointerType pBVar5;
  cmValue cVar6;
  string *__x;
  cmStateSnapshot *ci;
  pointer this_01;
  cmState *pcVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *r;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined1 auVar9 [16];
  cmStateSnapshot parent;
  cmStateSnapshot snp;
  cmStateSnapshot local_88;
  undefined1 local_70 [16];
  undefined1 local_60 [32];
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_40;
  cmState *local_38;
  
  if (GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_ == '\0') {
    GetProperty();
  }
  GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_string_length = 0;
  *GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p = '\0';
  iVar4 = std::__cxx11::string::compare((char *)prop);
  if (iVar4 == 0) {
    cmStateSnapshot::GetBuildsystemDirectoryParent(&local_88,&this->Snapshot_);
    bVar3 = cmStateSnapshot::IsValid(&local_88);
    if (bVar3) {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,&local_88);
      pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         ((iterator *)local_70);
      return (cmValue)&pBVar5->Location;
    }
    return (cmValue)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_;
  }
  __n = prop->_M_string_length;
  if ((__n == kBINARY_DIR_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar4 = bcmp((prop->_M_dataplus)._M_p,kBINARY_DIR_abi_cxx11_._M_dataplus._M_p,__n),
      iVar4 == 0)))) {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
              (&this->DirectoryState);
LAB_0034483e:
    std::__cxx11::string::_M_assign
              ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    return (cmValue)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_;
  }
  if ((__n == kSOURCE_DIR_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar4 = bcmp((prop->_M_dataplus)._M_p,kSOURCE_DIR_abi_cxx11_._M_dataplus._M_p,__n),
      iVar4 == 0)))) {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
              (&this->DirectoryState);
    goto LAB_0034483e;
  }
  if ((__n == kSUBDIRECTORIES_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar4 = bcmp((prop->_M_dataplus)._M_p,kSUBDIRECTORIES_abi_cxx11_._M_dataplus._M_p,__n),
      iVar4 == 0)))) {
    local_88.State = (cmState *)0x0;
    local_88.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
    local_88.Position.Position = 0;
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_88,
              ((long)(pBVar5->Children).
                     super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pBVar5->Children).
                     super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    this_01 = (pBVar5->Children).
              super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar2 = (pBVar5->Children).
             super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_01 != pcVar2) {
      do {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,this_01);
        pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                           ((iterator *)local_70);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_88,&pBVar5->Location);
        this_01 = this_01 + 1;
      } while (this_01 != pcVar2);
    }
    cmList::
    to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              ((string *)local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_88);
    goto LAB_00344a53;
  }
  if ((__n == kBUILDSYSTEM_TARGETS_abi_cxx11_._M_string_length) &&
     ((__n == 0 ||
      (iVar4 = bcmp((prop->_M_dataplus)._M_p,kBUILDSYSTEM_TARGETS_abi_cxx11_._M_dataplus._M_p,__n),
      iVar4 == 0)))) {
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    r = &pBVar5->NormalTargetNames;
LAB_003449ec:
    cmList::
    to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              ((string *)local_70,r);
LAB_00344ad5:
    std::__cxx11::string::operator=
              ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
               (string *)local_70);
    if ((cmState *)local_70._0_8_ == (cmState *)local_60) {
      return (cmValue)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_;
    }
    operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
    return (cmValue)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_;
  }
  if (__n == 0x10) {
    pcVar1 = (prop->_M_dataplus)._M_p;
    auVar9[0] = -(*pcVar1 == 'I');
    auVar9[1] = -(pcVar1[1] == 'M');
    auVar9[2] = -(pcVar1[2] == 'P');
    auVar9[3] = -(pcVar1[3] == 'O');
    auVar9[4] = -(pcVar1[4] == 'R');
    auVar9[5] = -(pcVar1[5] == 'T');
    auVar9[6] = -(pcVar1[6] == 'E');
    auVar9[7] = -(pcVar1[7] == 'D');
    auVar9[8] = -(pcVar1[8] == '_');
    auVar9[9] = -(pcVar1[9] == 'T');
    auVar9[10] = -(pcVar1[10] == 'A');
    auVar9[0xb] = -(pcVar1[0xb] == 'R');
    auVar9[0xc] = -(pcVar1[0xc] == 'G');
    auVar9[0xd] = -(pcVar1[0xd] == 'E');
    auVar9[0xe] = -(pcVar1[0xe] == 'T');
    auVar9[0xf] = -(pcVar1[0xf] == 'S');
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf)
        == 0xffff) {
      pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         (&this->DirectoryState);
      r = &pBVar5->ImportedTargetNames;
      goto LAB_003449ec;
    }
  }
  iVar4 = std::__cxx11::string::compare((char *)prop);
  if (iVar4 == 0) {
    local_88.State = (cmState *)0x0;
    local_88.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
    local_88.Position.Position = 0;
    local_38 = (cmState *)(this->Snapshot_).Position.Position;
    this_00 = (cmStateSnapshot *)(local_60 + 0x18);
    local_60._24_8_ = (this->Snapshot_).State;
    pcStack_40 = (this->Snapshot_).Position.Tree;
    while (bVar3 = cmStateSnapshot::IsValid(this_00), bVar3) {
      __x = cmStateSnapshot::GetExecutionListFile_abi_cxx11_(this_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88,__x);
      cmStateSnapshot::GetCallStackParent((cmStateSnapshot *)local_70,this_00);
      local_38 = (cmState *)local_60._0_8_;
      local_60._24_8_ = local_70._0_8_;
      pcStack_40 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_70._8_8_;
    }
    paVar8 = &(((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_88.Position.Tree + -1))->Value).field_2;
    pcVar7 = local_88.State;
    if (local_88.State < paVar8 && local_88.State != (cmState *)local_88.Position.Tree) {
      do {
        std::__cxx11::string::swap((string *)pcVar7);
        pcVar7 = (cmState *)
                 &((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)pcVar7)->Backtrace;
        paVar8 = paVar8 + -2;
      } while (pcVar7 < paVar8);
    }
    cmList::
    to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              ((string *)local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_88);
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)prop);
    if (iVar4 == 0) {
      cmState::GetCacheEntryKeys_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_88,(this->Snapshot_).State);
      cmList::
      to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                ((string *)local_70,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_88);
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)prop);
      if (iVar4 != 0) {
        iVar4 = std::__cxx11::string::compare((char *)prop);
        if (iVar4 == 0) {
          local_88._0_16_ = GetIncludeDirectoriesEntries_abi_cxx11_(this);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)prop);
          if (iVar4 == 0) {
            local_88._0_16_ = GetCompileOptionsEntries_abi_cxx11_(this);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)prop);
            if (iVar4 == 0) {
              local_88._0_16_ = GetCompileDefinitionsEntries_abi_cxx11_(this);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)prop);
              if (iVar4 == 0) {
                local_88._0_16_ = GetLinkOptionsEntries_abi_cxx11_(this);
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)prop);
                if (iVar4 != 0) {
                  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                           operator->(&this->DirectoryState);
                  cVar6 = cmPropertyMap::GetPropertyValue(&pBVar5->Properties,prop);
                  if (!chain || cVar6.Value != (string *)0x0) {
                    return (cmValue)cVar6.Value;
                  }
                  cmStateSnapshot::GetBuildsystemDirectoryParent(&local_88,&this->Snapshot_);
                  bVar3 = cmStateSnapshot::IsValid(&local_88);
                  if (bVar3) {
                    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,&local_88);
                    cVar6 = GetProperty((cmStateDirectory *)local_70,prop,true);
                    return (cmValue)cVar6.Value;
                  }
                  cVar6 = cmState::GetGlobalProperty((this->Snapshot_).State,prop);
                  return (cmValue)cVar6.Value;
                }
                local_88._0_16_ = GetLinkDirectoriesEntries_abi_cxx11_(this);
              }
            }
          }
        }
        cmList::
        to_string<cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_0>
                  ((string *)local_70,
                   (cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)&local_88);
        goto LAB_00344ad5;
      }
      cmStateSnapshot::ClosureKeys_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_88,&this->Snapshot_);
      cmState::GetCacheEntryKeys_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,(this->Snapshot_).State);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                 local_88.Position.Tree,local_70._0_8_,local_70._8_8_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_70);
      std::
      sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_88.State,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )local_88.Position.Tree);
      cmList::
      to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                ((string *)local_70,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_88);
    }
  }
LAB_00344a53:
  std::__cxx11::string::operator=
            ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
             (string *)local_70);
  if ((cmState *)local_70._0_8_ != (cmState *)local_60) {
    operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
  return (cmValue)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_;
}

Assistant:

cmValue cmStateDirectory::GetProperty(const std::string& prop,
                                      bool chain) const
{
  static std::string output;
  output.clear();
  if (prop == "PARENT_DIRECTORY") {
    cmStateSnapshot parent = this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parent.IsValid()) {
      return cmValue(parent.GetDirectory().GetCurrentSource());
    }
    return cmValue(output);
  }
  if (prop == kBINARY_DIR) {
    output = this->GetCurrentBinary();
    return cmValue(output);
  }
  if (prop == kSOURCE_DIR) {
    output = this->GetCurrentSource();
    return cmValue(output);
  }
  if (prop == kSUBDIRECTORIES) {
    std::vector<std::string> child_dirs;
    std::vector<cmStateSnapshot> const& children =
      this->DirectoryState->Children;
    child_dirs.reserve(children.size());
    for (cmStateSnapshot const& ci : children) {
      child_dirs.push_back(ci.GetDirectory().GetCurrentSource());
    }
    output = cmList::to_string(child_dirs);
    return cmValue(output);
  }
  if (prop == kBUILDSYSTEM_TARGETS) {
    output = cmList::to_string(this->DirectoryState->NormalTargetNames);
    return cmValue(output);
  }
  if (prop == "IMPORTED_TARGETS"_s) {
    output = cmList::to_string(this->DirectoryState->ImportedTargetNames);
    return cmValue(output);
  }

  if (prop == "LISTFILE_STACK") {
    std::vector<std::string> listFiles;
    cmStateSnapshot snp = this->Snapshot_;
    while (snp.IsValid()) {
      listFiles.push_back(snp.GetExecutionListFile());
      snp = snp.GetCallStackParent();
    }
    std::reverse(listFiles.begin(), listFiles.end());
    output = cmList::to_string(listFiles);
    return cmValue(output);
  }
  if (prop == "CACHE_VARIABLES") {
    output = cmList::to_string(this->Snapshot_.State->GetCacheEntryKeys());
    return cmValue(output);
  }
  if (prop == "VARIABLES") {
    std::vector<std::string> res = this->Snapshot_.ClosureKeys();
    cm::append(res, this->Snapshot_.State->GetCacheEntryKeys());
    std::sort(res.begin(), res.end());
    output = cmList::to_string(res);
    return cmValue(output);
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    output = cmList::to_string(this->GetIncludeDirectoriesEntries());
    return cmValue(output);
  }
  if (prop == "COMPILE_OPTIONS") {
    output = cmList::to_string(this->GetCompileOptionsEntries());
    return cmValue(output);
  }
  if (prop == "COMPILE_DEFINITIONS") {
    output = cmList::to_string(this->GetCompileDefinitionsEntries());
    return cmValue(output);
  }
  if (prop == "LINK_OPTIONS") {
    output = cmList::to_string(this->GetLinkOptionsEntries());
    return cmValue(output);
  }
  if (prop == "LINK_DIRECTORIES") {
    output = cmList::to_string(this->GetLinkDirectoriesEntries());
    return cmValue(output);
  }

  cmValue retVal = this->DirectoryState->Properties.GetPropertyValue(prop);
  if (!retVal && chain) {
    cmStateSnapshot parentSnapshot =
      this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parentSnapshot.IsValid()) {
      return parentSnapshot.GetDirectory().GetProperty(prop, chain);
    }
    return this->Snapshot_.State->GetGlobalProperty(prop);
  }

  return retVal;
}